

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int fts3CreateTables(Fts3Table *p)

{
  sqlite3 *db;
  char *pcVar1;
  uint in_EAX;
  char *p_00;
  ulong uVar2;
  int rc;
  undefined8 uStack_38;
  
  uStack_38 = (ulong)in_EAX;
  db = p->db;
  if (p->zContentTbl == (char *)0x0) {
    pcVar1 = p->zLanguageid;
    p_00 = sqlite3_mprintf("docid INTEGER PRIMARY KEY");
    if (p_00 != (char *)0x0) {
      uVar2 = 0;
      do {
        if ((long)p->nColumn <= (long)uVar2) {
          if (pcVar1 != (char *)0x0) {
            p_00 = sqlite3_mprintf("%z, langid",p_00,pcVar1);
            if (p_00 == (char *)0x0) break;
          }
          fts3DbExec((int *)((long)&uStack_38 + 4),db,"CREATE TABLE %Q.\'%q_content\'(%s)",p->zDb,
                     p->zName,p_00);
          sqlite3_free(p_00);
          goto LAB_001bca5f;
        }
        p_00 = sqlite3_mprintf("%z, \'c%d%q\'",p_00,uVar2 & 0xffffffff,p->azColumn[uVar2]);
        uVar2 = uVar2 + 1;
      } while (p_00 != (char *)0x0);
    }
    uStack_38 = CONCAT44(7,(undefined4)uStack_38);
    fts3DbExec((int *)((long)&uStack_38 + 4),db,"CREATE TABLE %Q.\'%q_content\'(%s)",p->zDb,p->zName
               ,0);
  }
LAB_001bca5f:
  fts3DbExec((int *)((long)&uStack_38 + 4),db,
             "CREATE TABLE %Q.\'%q_segments\'(blockid INTEGER PRIMARY KEY, block BLOB);",p->zDb,
             p->zName);
  fts3DbExec((int *)((long)&uStack_38 + 4),db,
             "CREATE TABLE %Q.\'%q_segdir\'(level INTEGER,idx INTEGER,start_block INTEGER,leaves_end_block INTEGER,end_block INTEGER,root BLOB,PRIMARY KEY(level, idx));"
             ,p->zDb,p->zName);
  if (p->bHasDocsize != '\0') {
    fts3DbExec((int *)((long)&uStack_38 + 4),db,
               "CREATE TABLE %Q.\'%q_docsize\'(docid INTEGER PRIMARY KEY, size BLOB);",p->zDb,
               p->zName);
  }
  if (p->bHasStat != '\0') {
    sqlite3Fts3CreateStatTable((int *)((long)&uStack_38 + 4),p);
  }
  return uStack_38._4_4_;
}

Assistant:

static int fts3CreateTables(Fts3Table *p){
  int rc = SQLITE_OK;             /* Return code */
  int i;                          /* Iterator variable */
  sqlite3 *db = p->db;            /* The database connection */

  if( p->zContentTbl==0 ){
    const char *zLanguageid = p->zLanguageid;
    char *zContentCols;           /* Columns of %_content table */

    /* Create a list of user columns for the content table */
    zContentCols = sqlite3_mprintf("docid INTEGER PRIMARY KEY");
    for(i=0; zContentCols && i<p->nColumn; i++){
      char *z = p->azColumn[i];
      zContentCols = sqlite3_mprintf("%z, 'c%d%q'", zContentCols, i, z);
    }
    if( zLanguageid && zContentCols ){
      zContentCols = sqlite3_mprintf("%z, langid", zContentCols, zLanguageid);
    }
    if( zContentCols==0 ) rc = SQLITE_NOMEM;
  
    /* Create the content table */
    fts3DbExec(&rc, db, 
       "CREATE TABLE %Q.'%q_content'(%s)",
       p->zDb, p->zName, zContentCols
    );
    sqlite3_free(zContentCols);
  }

  /* Create other tables */
  fts3DbExec(&rc, db, 
      "CREATE TABLE %Q.'%q_segments'(blockid INTEGER PRIMARY KEY, block BLOB);",
      p->zDb, p->zName
  );
  fts3DbExec(&rc, db, 
      "CREATE TABLE %Q.'%q_segdir'("
        "level INTEGER,"
        "idx INTEGER,"
        "start_block INTEGER,"
        "leaves_end_block INTEGER,"
        "end_block INTEGER,"
        "root BLOB,"
        "PRIMARY KEY(level, idx)"
      ");",
      p->zDb, p->zName
  );
  if( p->bHasDocsize ){
    fts3DbExec(&rc, db, 
        "CREATE TABLE %Q.'%q_docsize'(docid INTEGER PRIMARY KEY, size BLOB);",
        p->zDb, p->zName
    );
  }
  assert( p->bHasStat==p->bFts4 );
  if( p->bHasStat ){
    sqlite3Fts3CreateStatTable(&rc, p);
  }
  return rc;
}